

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Context *pCVar4;
  bool bVar5;
  TestNode *node;
  TestNode *node_00;
  long *plVar6;
  Texture2DFilteringCase *this_00;
  ulong uVar7;
  long lVar8;
  TextureCubeFilteringCase *this_01;
  long *plVar9;
  size_type *psVar10;
  byte bVar11;
  long lVar12;
  bool bVar13;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  uint local_17c;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  uint local_114;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string name;
  long *local_c0 [2];
  long local_b0 [2];
  long local_a0;
  undefined8 local_98;
  undefined8 local_90;
  long local_88;
  long local_80;
  ulong local_78;
  anon_struct_16_2_3f8b7511 *local_70;
  ulong local_68;
  anon_struct_16_2_3f8b7511 *local_60;
  ulong local_58;
  anon_struct_16_2_3f8b7511 *local_50;
  TextureFilteringTests *local_48;
  long local_40;
  TestNode *local_38;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_48 = this;
  local_38 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  lVar8 = 0;
  do {
    local_70 = init::minFilterModes + lVar8;
    uVar1 = init::minFilterModes[lVar8].mode;
    local_78 = (ulong)uVar1;
    local_17c = uVar1 & 0xfffffffe;
    local_98 = CONCAT44(local_98._4_4_,uVar1) & 0xfffffffffffffffe ^ 0x2600;
    lVar12 = 0;
    local_40 = lVar8;
    do {
      local_60 = init::magFilterModes + lVar12;
      local_68 = (ulong)init::magFilterModes[lVar12].mode;
      local_114 = init::magFilterModes[lVar12].mode ^ 0x2600;
      uVar7 = 0;
      local_a0 = lVar12;
      do {
        local_50 = init::wrapModes + uVar7;
        uVar1 = init::wrapModes[uVar7].mode;
        local_58 = (ulong)uVar1;
        bVar5 = (int)local_98 == 0;
        local_88 = CONCAT71(local_88._1_7_,uVar1 == 0x2901 && local_114 == 0);
        lVar8 = 0;
        local_90 = uVar7;
        do {
          bVar11 = (lVar8 == 0 || local_17c == 0x2600) | (byte)local_88;
          lVar12 = 0;
          local_80 = lVar8;
          do {
            uVar2 = *(uint *)((long)&init::sizes2D[0].width + lVar12);
            if ((uVar2 & uVar2 - 1) == 0) {
              uVar3 = *(uint *)((long)&init::sizes2D[0].height + lVar12);
              bVar13 = (uVar3 & uVar3 - 1) == 0;
            }
            else {
              bVar13 = false;
            }
            if (((bVar13 | (uVar1 == 0x812f && bVar5)) & bVar11) == 1) {
              local_c0[0] = local_b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,0x1b32ab9);
              plVar6 = (long *)std::__cxx11::string::append((char *)local_c0);
              local_178 = &local_168;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_168 = *plVar9;
                lStack_160 = plVar6[3];
              }
              else {
                local_168 = *plVar9;
                local_178 = (long *)*plVar6;
              }
              local_170 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
              local_158 = &local_148;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_148 = *plVar9;
                lStack_140 = plVar6[3];
              }
              else {
                local_148 = *plVar9;
                local_158 = (long *)*plVar6;
              }
              local_150 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
              local_138 = &local_128;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_128 = *plVar9;
                lStack_120 = plVar6[3];
              }
              else {
                local_128 = *plVar9;
                local_138 = (long *)*plVar6;
              }
              local_130 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
              local_110 = &local_100;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_100 = *plVar9;
                lStack_f8 = plVar6[3];
              }
              else {
                local_100 = *plVar9;
                local_110 = (long *)*plVar6;
              }
              local_108 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
              local_1a0 = &local_190;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_190 = *plVar9;
                lStack_188 = plVar6[3];
              }
              else {
                local_190 = *plVar9;
                local_1a0 = (long *)*plVar6;
              }
              local_198 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
              local_1c0 = &local_1b0;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_1b0 = *plVar9;
                lStack_1a8 = plVar6[3];
              }
              else {
                local_1b0 = *plVar9;
                local_1c0 = (long *)*plVar6;
              }
              local_1b8 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c0);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar10 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar10) {
                name.field_2._M_allocated_capacity = *psVar10;
                name.field_2._8_8_ = plVar6[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar10;
                name._M_dataplus._M_p = (pointer)*plVar6;
              }
              name._M_string_length = plVar6[1];
              *plVar6 = (long)psVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if (local_1c0 != &local_1b0) {
                operator_delete(local_1c0,local_1b0 + 1);
              }
              if (local_1a0 != &local_190) {
                operator_delete(local_1a0,local_190 + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,local_100 + 1);
              }
              if (local_138 != &local_128) {
                operator_delete(local_138,local_128 + 1);
              }
              if (local_158 != &local_148) {
                operator_delete(local_158,local_148 + 1);
              }
              if (local_178 != &local_168) {
                operator_delete(local_178,local_168 + 1);
              }
              if (local_c0[0] != local_b0) {
                operator_delete(local_c0[0],local_b0[0] + 1);
              }
              if (local_17c == 0x2600) {
                local_1a0 = &local_190;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"_","");
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                local_1c0 = &local_1b0;
                plVar9 = plVar6 + 2;
                if ((long *)*plVar6 == plVar9) {
                  local_1b0 = *plVar9;
                  lStack_1a8 = plVar6[3];
                }
                else {
                  local_1b0 = *plVar9;
                  local_1c0 = (long *)*plVar6;
                }
                local_1b8 = plVar6[1];
                *plVar6 = (long)plVar9;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&name,(ulong)local_1c0);
                if (local_1c0 != &local_1b0) {
                  operator_delete(local_1c0,local_1b0 + 1);
                }
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,local_190 + 1);
                }
              }
              this_00 = (Texture2DFilteringCase *)operator_new(0x128);
              pCVar4 = (local_48->super_TestCaseGroup).m_context;
              Texture2DFilteringCase::Texture2DFilteringCase
                        (this_00,(local_48->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                         name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                         (deUint32)local_78,(deUint32)local_68,(deUint32)local_58,(deUint32)local_58
                         ,init::formats[lVar8].format,init::formats[lVar8].dataType,uVar2,
                         *(int *)((long)&init::sizes2D[0].height + lVar12));
              tcu::TestNode::addChild(node,(TestNode *)this_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            lVar12 = lVar12 + 0x10;
          } while (lVar12 == 0x10);
          lVar8 = local_80 + 1;
        } while (local_80 == 0);
        uVar7 = local_90 + 1;
      } while (uVar7 != 3);
      lVar12 = local_a0 + 1;
    } while (local_a0 == 0);
    lVar8 = local_40 + 1;
  } while (lVar8 != 6);
  local_a0 = 0;
  do {
    local_70 = (anon_struct_16_2_3f8b7511 *)(ulong)init::minFilterModes[local_a0].mode;
    local_17c = init::minFilterModes[local_a0].mode & 0xfffffffe;
    local_114 = local_17c ^ 0x2600;
    lVar8 = 0;
    do {
      local_60 = init::magFilterModes + lVar8;
      local_68 = (ulong)init::magFilterModes[lVar8].mode;
      local_90 = CONCAT44(local_90._4_4_,init::magFilterModes[lVar8].mode) ^ 0x2600;
      local_88 = 0;
      local_98 = lVar8;
      do {
        local_50 = init::wrapModes + local_88;
        uVar1 = init::wrapModes[local_88].mode;
        local_58 = (ulong)uVar1;
        bVar5 = local_114 == 0;
        local_80 = CONCAT71(local_80._1_7_,uVar1 == 0x2901 && (int)local_90 == 0);
        lVar8 = 0;
        do {
          bVar11 = (lVar8 == 0 || local_17c == 0x2600) | (byte)local_80;
          lVar12 = 0;
          local_78 = lVar8;
          do {
            uVar2 = *(uint *)((long)&init::sizesCube[0].width + lVar12);
            if ((uVar2 & uVar2 - 1) == 0) {
              uVar3 = *(uint *)((long)&init::sizesCube[0].height + lVar12);
              bVar13 = (uVar3 & uVar3 - 1) == 0;
            }
            else {
              bVar13 = false;
            }
            if (((bVar13 | (uVar1 == 0x812f && bVar5)) & bVar11) == 1) {
              local_c0[0] = local_b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,0x1b32ab9);
              plVar6 = (long *)std::__cxx11::string::append((char *)local_c0);
              local_178 = &local_168;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_168 = *plVar9;
                lStack_160 = plVar6[3];
              }
              else {
                local_168 = *plVar9;
                local_178 = (long *)*plVar6;
              }
              local_170 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
              local_158 = &local_148;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_148 = *plVar9;
                lStack_140 = plVar6[3];
              }
              else {
                local_148 = *plVar9;
                local_158 = (long *)*plVar6;
              }
              local_150 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
              local_138 = &local_128;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_128 = *plVar9;
                lStack_120 = plVar6[3];
              }
              else {
                local_128 = *plVar9;
                local_138 = (long *)*plVar6;
              }
              local_130 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
              local_110 = &local_100;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_100 = *plVar9;
                lStack_f8 = plVar6[3];
              }
              else {
                local_100 = *plVar9;
                local_110 = (long *)*plVar6;
              }
              local_108 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
              local_1a0 = &local_190;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_190 = *plVar9;
                lStack_188 = plVar6[3];
              }
              else {
                local_190 = *plVar9;
                local_1a0 = (long *)*plVar6;
              }
              local_198 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
              local_1c0 = &local_1b0;
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_1b0 = *plVar9;
                lStack_1a8 = plVar6[3];
              }
              else {
                local_1b0 = *plVar9;
                local_1c0 = (long *)*plVar6;
              }
              local_1b8 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c0);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar10 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar10) {
                name.field_2._M_allocated_capacity = *psVar10;
                name.field_2._8_8_ = plVar6[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar10;
                name._M_dataplus._M_p = (pointer)*plVar6;
              }
              name._M_string_length = plVar6[1];
              *plVar6 = (long)psVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if (local_1c0 != &local_1b0) {
                operator_delete(local_1c0,local_1b0 + 1);
              }
              if (local_1a0 != &local_190) {
                operator_delete(local_1a0,local_190 + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,local_100 + 1);
              }
              if (local_138 != &local_128) {
                operator_delete(local_138,local_128 + 1);
              }
              if (local_158 != &local_148) {
                operator_delete(local_158,local_148 + 1);
              }
              if (local_178 != &local_168) {
                operator_delete(local_178,local_168 + 1);
              }
              if (local_c0[0] != local_b0) {
                operator_delete(local_c0[0],local_b0[0] + 1);
              }
              if (local_17c == 0x2600) {
                local_1a0 = &local_190;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"_","");
                plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                local_1c0 = &local_1b0;
                plVar9 = plVar6 + 2;
                if ((long *)*plVar6 == plVar9) {
                  local_1b0 = *plVar9;
                  lStack_1a8 = plVar6[3];
                }
                else {
                  local_1b0 = *plVar9;
                  local_1c0 = (long *)*plVar6;
                }
                local_1b8 = plVar6[1];
                *plVar6 = (long)plVar9;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&name,(ulong)local_1c0);
                if (local_1c0 != &local_1b0) {
                  operator_delete(local_1c0,local_1b0 + 1);
                }
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,local_190 + 1);
                }
              }
              this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
              pCVar4 = (local_48->super_TestCaseGroup).m_context;
              TextureCubeFilteringCase::TextureCubeFilteringCase
                        (this_01,(local_48->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                         name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                         (deUint32)local_70,(deUint32)local_68,(deUint32)local_58,(deUint32)local_58
                         ,init::formats[lVar8].format,init::formats[lVar8].dataType,uVar2,
                         *(int *)((long)&init::sizesCube[0].height + lVar12));
              tcu::TestNode::addChild(local_38,(TestNode *)this_01);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
            }
            lVar12 = lVar12 + 0x10;
          } while (lVar12 == 0x10);
          lVar8 = local_78 + 1;
        } while (local_78 == 0);
        local_88 = local_88 + 1;
      } while (local_88 != 3);
      lVar8 = local_98 + 1;
    } while (local_98 == 0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != 6);
  return 6;
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE			},
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizes2D[size].width) && deIsPowerOfTwo32(sizes2D[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if ((format != 0) && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format, formats[format].dataType,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizesCube[size].width) && deIsPowerOfTwo32(sizesCube[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if (format != 0 && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 formats[format].format, formats[format].dataType,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}